

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O2

void stripctrl_check_line_limit(StripCtrlCharsImpl *scc,wchar_t wc,size_t width)

{
  ulong uVar1;
  ptrlen pl;
  ptrlen pl_00;
  
  if (scc->line_limit == true) {
    if (scc->line_start == true) {
      pl.len = 2;
      pl.ptr = "| ";
      BinarySink_put_datapl(scc->bs_out->binarysink_,pl);
      scc->line_start = false;
      scc->line_chars_remaining = 0x4d;
    }
    if (wc == L'\n') {
      scc->line_start = true;
    }
    else {
      uVar1 = scc->line_chars_remaining;
      if (uVar1 < width) {
        pl_00.len = 4;
        pl_00.ptr = "\r\n> ";
        BinarySink_put_datapl(scc->bs_out->binarysink_,pl_00);
        scc->line_chars_remaining = 0x4d;
        uVar1 = 0x4d;
      }
      if (uVar1 < width) {
        __assert_fail("width <= scc->line_chars_remaining",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x9c,"void stripctrl_check_line_limit(StripCtrlCharsImpl *, wchar_t, size_t)"
                     );
      }
      scc->line_chars_remaining = uVar1 - width;
    }
  }
  return;
}

Assistant:

static inline void stripctrl_check_line_limit(
    StripCtrlCharsImpl *scc, wchar_t wc, size_t width)
{
    if (!scc->line_limit)
        return;                        /* nothing to do */

    if (scc->line_start) {
        put_datapl(scc->bs_out, PTRLEN_LITERAL("| "));
        scc->line_start = false;
        scc->line_chars_remaining = LINE_LIMIT;
    }

    if (wc == '\n') {
        scc->line_start = true;
        return;
    }

    if (scc->line_chars_remaining < width) {
        put_datapl(scc->bs_out, PTRLEN_LITERAL("\r\n> "));
        scc->line_chars_remaining = LINE_LIMIT;
    }

    assert(width <= scc->line_chars_remaining);
    scc->line_chars_remaining -= width;
}